

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command_line.cpp
# Opt level: O0

void __thiscall
ClCommandLine_SingleLetterStringOption_Test::ClCommandLine_SingleLetterStringOption_Test
          (ClCommandLine_SingleLetterStringOption_Test *this)

{
  ClCommandLine_SingleLetterStringOption_Test *this_local;
  
  anon_unknown.dwarf_19dfa::ClCommandLine::ClCommandLine(&this->super_ClCommandLine);
  (this->super_ClCommandLine).super_Test._vptr_Test =
       (_func_int **)&PTR__ClCommandLine_SingleLetterStringOption_Test_00244c08;
  return;
}

Assistant:

TEST_F (ClCommandLine, SingleLetterStringOption) {
    opt<std::string> option ("S");
    this->add ("progname", "-Svalue");

    string_stream output;
    string_stream errors;
    bool const res = this->parse_command_line_options (output, errors);
    EXPECT_TRUE (res);

    EXPECT_EQ (errors.str ().length (), 0U);
    EXPECT_EQ (output.str ().length (), 0U);

    EXPECT_EQ (option.get (), "value");
    EXPECT_EQ (option.get_num_occurrences (), 1U);
}